

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

void __thiscall tf::Graph::~Graph(Graph *this)

{
  Graph *this_local;
  
  _clear(this);
  std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>::~vector(&this->_nodes);
  return;
}

Assistant:

inline Graph::~Graph() {
  _clear();
}